

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall
create::Create::defineSong
          (Create *this,uint8_t *songNumber,uint8_t *songLength,uint8_t *notes,float *durations)

{
  byte bVar1;
  value_type vVar2;
  value_type vVar3;
  reference pvVar4;
  element_type *this_00;
  uchar *puVar5;
  size_type sVar6;
  ssize_t sVar7;
  uint uVar8;
  int __flags;
  allocator<unsigned_char> local_61;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> cmd;
  int local_40;
  int iStack_3c;
  uint8_t duration;
  int j;
  int i;
  float *durations_local;
  uint8_t *notes_local;
  uint8_t *songLength_local;
  uint8_t *songNumber_local;
  Create *this_local;
  size_t __n;
  
  __flags = (int)durations;
  bVar1 = *songLength;
  std::allocator<unsigned_char>::allocator(&local_61);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (ulong)(bVar1 + 3 + (uint)bVar1),&local_61);
  std::allocator<unsigned_char>::~allocator(&local_61);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  *pvVar4 = 0x8c;
  vVar2 = *songNumber;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,1);
  *pvVar4 = vVar2;
  vVar2 = *songLength;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,2);
  *pvVar4 = vVar2;
  local_40 = 0;
  iStack_3c = 3;
  do {
    uVar8 = (uint)*songLength * 2 + 3;
    __n = (size_t)uVar8;
    if ((int)uVar8 <= iStack_3c) {
      this_00 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->serial);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      sVar7 = Serial::send(this_00,(int)puVar5,(void *)(sVar6 & 0xffffffff),__n,__flags);
      this_local._7_1_ = (bool)((byte)sVar7 & 1);
LAB_001a0ba7:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      return this_local._7_1_;
    }
    if ((durations[local_40] <= 0.0 && durations[local_40] != 0.0) || (4.0 <= durations[local_40]))
    {
      this_local._7_1_ = false;
      goto LAB_001a0ba7;
    }
    cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = (value_type)(int)(durations[local_40] * 64.0);
    vVar2 = notes[local_40];
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                        (long)iStack_3c);
    vVar3 = cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_;
    *pvVar4 = vVar2;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                        (long)(iStack_3c + 1));
    *pvVar4 = vVar3;
    local_40 = local_40 + 1;
    iStack_3c = iStack_3c + 2;
  } while( true );
}

Assistant:

bool Create::defineSong(const uint8_t& songNumber,
                          const uint8_t& songLength,
                          const uint8_t* notes,
                          const float* durations) const {
    int i, j;
    uint8_t duration;
    std::vector<uint8_t> cmd(2 * songLength + 3);
    cmd[0] = OC_SONG;
    cmd[1] = songNumber;
    cmd[2] = songLength;
    j = 0;
    for (i = 3; i < 2 * songLength + 3; i = i + 2) {
      if (durations[j] < 0 || durations[j] >= 4)
        return false;
      duration = durations[j] * 64;
      cmd[i] = notes[j];
      cmd[i + 1] = duration;
      j++;
    }

    return serial->send(cmd.data(), cmd.size());
  }